

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcAdjacencyInfo.h
# Opt level: O0

long __thiscall o3dgc::AdjacencyInfo::Begin(AdjacencyInfo *this,long element)

{
  long local_28;
  long element_local;
  AdjacencyInfo *this_local;
  
  if (this->m_numElements <= element) {
    __assert_fail("element < m_numElements",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/../contrib/Open3DGC/o3dgcAdjacencyInfo.h"
                  ,0x7b,"long o3dgc::AdjacencyInfo::Begin(long) const");
  }
  if (-1 < element) {
    if (element < 1) {
      local_28 = 0;
    }
    else {
      local_28 = this->m_numNeighbors[element + -1];
    }
    return local_28;
  }
  __assert_fail("element >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/../contrib/Open3DGC/o3dgcAdjacencyInfo.h"
                ,0x7c,"long o3dgc::AdjacencyInfo::Begin(long) const");
}

Assistant:

long                    Begin(long element) const 
                                {
                                    assert(element < m_numElements);
                                    assert(element >= 0);
                                    return (element>0)?m_numNeighbors[element-1]:0;
                                }